

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# padding_pack8_int8.h
# Opt level: O0

void ncnn::padding_constant_pack8_int8_sse
               (Mat *src,Mat *dst,int top,int bottom,int left,int right,int64_t _v)

{
  int x_4;
  int y_2;
  int x_3;
  int x_2;
  int x_1;
  int y_1;
  int x;
  int y;
  int64_t *outptr;
  int64_t *ptr;
  int right_local;
  int left_local;
  int bottom_local;
  int top_local;
  Mat *dst_local;
  Mat *src_local;
  
  ptr = (int64_t *)src->data;
  outptr = (int64_t *)dst->data;
  for (y = 0; y < top; y = y + 1) {
    for (x = 0; x < dst->w; x = x + 1) {
      *outptr = _v;
      outptr = outptr + 1;
    }
  }
  for (y_1 = 0; y_1 < src->h; y_1 = y_1 + 1) {
    for (x_1 = 0; x_1 < left; x_1 = x_1 + 1) {
      *outptr = _v;
      outptr = outptr + 1;
    }
    for (x_2 = 0; x_2 < src->w; x_2 = x_2 + 1) {
      *outptr = *ptr;
      outptr = outptr + 1;
      ptr = ptr + 1;
    }
    for (x_3 = 0; x_3 < right; x_3 = x_3 + 1) {
      *outptr = _v;
      outptr = outptr + 1;
    }
  }
  for (y_2 = 0; y_2 < bottom; y_2 = y_2 + 1) {
    for (x_4 = 0; x_4 < dst->w; x_4 = x_4 + 1) {
      *outptr = _v;
      outptr = outptr + 1;
    }
  }
  return;
}

Assistant:

static void padding_constant_pack8_int8_sse(const Mat& src, Mat& dst, int top, int bottom, int left, int right, int64_t _v)
{
    const int64_t* ptr = src;
    int64_t* outptr = dst;

    // fill top
    for (int y = 0; y < top; y++)
    {
        for (int x = 0; x < dst.w; x++)
        {
            *outptr++ = _v;
        }
    }
    // fill center
    for (int y = 0; y < src.h; y++)
    {
        for (int x = 0; x < left; x++)
        {
            *outptr++ = _v;
        }
        for (int x = 0; x < src.w; x++)
        {
            *outptr++ = *ptr++;
        }
        for (int x = 0; x < right; x++)
        {
            *outptr++ = _v;
        }
    }
    // fill bottom
    for (int y = 0; y < bottom; y++)
    {
        for (int x = 0; x < dst.w; x++)
        {
            *outptr++ = _v;
        }
    }
}